

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdevicediscovery_p.cpp
# Opt level: O0

int __thiscall QDeviceDiscovery::qt_metacall(QDeviceDiscovery *this,Call _c,int _id,void **_a)

{
  long lVar1;
  undefined8 *in_RCX;
  uint in_EDX;
  int in_ESI;
  void **in_RDI;
  long in_FS_OFFSET;
  int local_28;
  int in_stack_ffffffffffffffe8;
  Call in_stack_ffffffffffffffec;
  QMetaType in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = QObject::qt_metacall((Call)in_RDI,in_ESI,(void **)(ulong)in_EDX);
  if (-1 < local_28) {
    if (in_ESI == 0) {
      if (local_28 < 2) {
        qt_static_metacall((QObject *)in_stack_fffffffffffffff0.d_ptr,in_stack_ffffffffffffffec,
                           in_stack_ffffffffffffffe8,in_RDI);
      }
      local_28 = local_28 + -2;
    }
    if (in_ESI == 7) {
      if (local_28 < 2) {
        memset(&stack0xfffffffffffffff0,0,8);
        QMetaType::QMetaType((QMetaType *)&stack0xfffffffffffffff0);
        *(QMetaTypeInterface **)*in_RCX = in_stack_fffffffffffffff0.d_ptr;
      }
      local_28 = local_28 + -2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

int QDeviceDiscovery::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QObject::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 2)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 2;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 2)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 2;
    }
    return _id;
}